

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Browser.cxx
# Opt level: O3

void __thiscall
Fl_File_Browser::item_draw(Fl_File_Browser *this,void *p,int X,int Y,int W,int param_5)

{
  uint uVar1;
  byte bVar2;
  char cVar3;
  Fl_File_Icon *this_00;
  int *piVar4;
  Fl_Color fg;
  int iVar5;
  int iVar6;
  int h;
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  Fl_Color ic;
  char *__s;
  int iVar11;
  uint uVar12;
  int local_2850;
  char fragment [10240];
  
  __s = (char *)((long)p + 0x23);
  sVar7 = strlen(__s);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,
             (ulong)((uint)(*(char *)(sVar7 + 0x22 + (long)p) == '/') |
                    (this->super_Fl_Browser).super_Fl_Browser_.textfont_),
             (ulong)(uint)(this->super_Fl_Browser).super_Fl_Browser_.textsize_);
  fg = (this->super_Fl_Browser).super_Fl_Browser_.textcolor_;
  if ((*(byte *)((long)p + 0x22) & 1) != 0) {
    fg = fl_contrast(fg,(this->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.super_Fl_Widget.
                        color2_);
  }
  if (Fl_File_Icon::first_ != (Fl_File_Icon *)0x0) {
    this_00 = *(Fl_File_Icon **)((long)p + 0x10);
    if (this_00 != (Fl_File_Icon *)0x0) {
      bVar2 = this->iconsize_;
      ic = 0x5f;
      if ((*(byte *)((long)p + 0x22) & 1) == 0) {
        ic = 0x34;
      }
      iVar5 = Fl_Widget::active_r((Fl_Widget *)this);
      Fl_File_Icon::draw(this_00,X,Y,(uint)bVar2,(uint)bVar2,ic,iVar5);
    }
    bVar2 = this->iconsize_;
    iVar5 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
    pcVar9 = __s;
    do {
      if (*pcVar9 == '\n') {
        iVar6 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
        iVar5 = iVar5 + iVar6;
      }
      else if (*pcVar9 == '\0') goto LAB_001acdb6;
      pcVar9 = pcVar9 + 1;
    } while( true );
  }
  iVar11 = X + 1;
  local_2850 = W + -2;
LAB_001acde4:
  piVar4 = (this->super_Fl_Browser).column_widths_;
  iVar5 = Fl_Widget::active_r((Fl_Widget *)this);
  if (iVar5 == 0) {
    fg = fl_inactive(fg);
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)fg);
  iVar5 = 0;
  pcVar9 = fragment;
  uVar12 = 0;
  do {
    cVar3 = *__s;
    if (cVar3 == '\n') {
      *pcVar9 = '\0';
      iVar6 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
      fl_draw(fragment,iVar5 + iVar11,Y,local_2850 - iVar5,iVar6,0x44,(Fl_Image *)0x0,0);
      iVar5 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
      Y = Y + iVar5;
      iVar5 = 0;
      pcVar9 = fragment;
      uVar12 = 0;
    }
    else {
      if (cVar3 == '\0') {
        if (fragment < pcVar9) {
          *pcVar9 = '\0';
          iVar6 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
          fl_draw(fragment,iVar11 + iVar5,Y,local_2850 - iVar5,iVar6,0x44,(Fl_Image *)0x0,0);
        }
        return;
      }
      if (cVar3 == (this->super_Fl_Browser).column_char_) {
        iVar6 = local_2850 - iVar5;
        *pcVar9 = '\0';
        if (piVar4 != (int *)0x0) {
          if ((int)uVar12 < 1) {
            uVar10 = 0;
          }
          else {
            uVar8 = 0;
            do {
              uVar10 = uVar8;
              if (piVar4[uVar8] == 0) break;
              uVar8 = uVar8 + 1;
              uVar10 = (ulong)uVar12;
            } while (uVar12 != uVar8);
            uVar10 = uVar10 & 0xffffffff;
          }
          if (piVar4[uVar10] != 0) {
            iVar6 = piVar4[uVar10];
          }
        }
        h = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
        fl_draw(fragment,iVar5 + iVar11,Y,iVar6,h,0x44,(Fl_Image *)0x0,0);
        uVar1 = uVar12 + 1;
        if (piVar4 == (int *)0x0) {
          iVar5 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
          iVar5 = (int)((double)iVar5 * 0.6 * 8.0) * uVar1;
        }
        else {
          if (-1 < (int)uVar12) {
            uVar10 = 0;
            iVar5 = 0;
            pcVar9 = fragment;
            do {
              uVar12 = uVar1;
              if (piVar4[uVar10] == 0) break;
              iVar5 = iVar5 + piVar4[uVar10];
              uVar10 = uVar10 + 1;
            } while (uVar1 != uVar10);
            goto LAB_001acfc4;
          }
          iVar5 = 0;
        }
        pcVar9 = fragment;
        uVar12 = uVar1;
      }
      else {
        *pcVar9 = cVar3;
        pcVar9 = pcVar9 + 1;
      }
    }
LAB_001acfc4:
    __s = __s + 1;
  } while( true );
LAB_001acdb6:
  iVar11 = X + 9 + (uint)bVar2;
  local_2850 = (W + 10) - (uint)bVar2;
  iVar6 = (uint)this->iconsize_ - iVar5;
  if (iVar6 != 0 && iVar5 <= (int)(uint)this->iconsize_) {
    Y = Y + iVar6 / 2;
  }
  goto LAB_001acde4;
}

Assistant:

void
Fl_File_Browser::item_draw(void *p,	// I - List item data
                 	   int  X,	// I - Upper-lefthand X coordinate
		 	   int  Y,	// I - Upper-lefthand Y coordinate
		 	   int  W,	// I - Width of item
			   int) const	// I - Height of item
{
  int		i;			// Looping var
  FL_BLINE	*line;			// Pointer to line
  Fl_Color	c;			// Text color
  char		*t,			// Pointer into text
		*ptr,			// Pointer into fragment
		fragment[10240];	// Fragment of text
  int		width,			// Width of line
		height;			// Height of line
  int		column;			// Current column
  const int	*columns;		// Columns


  // Draw the list item text...
  line = (FL_BLINE *)p;

  if (line->txt[strlen(line->txt) - 1] == '/')
    fl_font(textfont() | FL_BOLD, textsize());
  else
    fl_font(textfont(), textsize());

  if (line->flags & SELECTED)
    c = fl_contrast(textcolor(), selection_color());
  else
    c = textcolor();

  if (Fl_File_Icon::first() == NULL)
  {
    // No icons, just draw the text...
    X ++;
    W -= 2;
  }
  else
  {
    // Draw the icon if it is set...
    if (line->data)
      ((Fl_File_Icon *)line->data)->draw(X, Y, iconsize_, iconsize_,
                                	(line->flags & SELECTED) ? FL_YELLOW :
				                                   FL_LIGHT2,
					active_r());

    // Draw the text offset to the right...
    X += iconsize_ + 9;
    W -= iconsize_ - 10;

    // Center the text vertically...
    height = fl_height();

    for (t = line->txt; *t != '\0'; t ++)
      if (*t == '\n')
	height += fl_height();

    if (height < iconsize_)
      Y += (iconsize_ - height) / 2;
  }

  // Draw the text...
  line    = (FL_BLINE *)p;
  columns = column_widths();
  width   = 0;
  column  = 0;

  if (active_r())
    fl_color(c);
  else
    fl_color(fl_inactive(c));

  for (t = line->txt, ptr = fragment; *t != '\0'; t ++) {
    if (*t == '\n') {
      // Newline - nul terminate this fragment and draw it...
      *ptr = '\0';

      fl_draw(fragment, X + width, Y, W - width, fl_height(),
              (Fl_Align)(FL_ALIGN_LEFT | FL_ALIGN_CLIP), 0, 0);

      // Point back to the start of the fragment...
      ptr    = fragment;
      width  = 0;
      Y      += fl_height();
      column = 0;
    } else if (*t == column_char()) {
      // Tab - nul terminate this fragment and draw it...
      *ptr = '\0';

      int cW = W - width; // Clip width...

      if (columns) {
	// Try clipping inside this column...
	for (i = 0; i < column && columns[i]; i ++) { ; }

	if (columns[i])
	  cW = columns[i];
      }

      fl_draw(fragment, X + width, Y, cW, fl_height(),
              (Fl_Align)(FL_ALIGN_LEFT | FL_ALIGN_CLIP), 0, 0);

      // Advance to the next column...
      column ++;
      if (columns) {
	for (i = 0, width = 0; i < column && columns[i]; i ++)
	  width += columns[i];
      }
      else
	width = column * (int)(fl_height() * 0.6 * 8.0);
      ptr = fragment;
    }
    else
      *ptr++ = *t;
  }
  if (ptr > fragment) {
    // Nul terminate this fragment and draw it...
    *ptr = '\0';

    fl_draw(fragment, X + width, Y, W - width, fl_height(),
            (Fl_Align)(FL_ALIGN_LEFT | FL_ALIGN_CLIP), 0, 0);
  }
}